

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_table_function.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformRangeFunction(Transformer *this,PGRangeFunction *root)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  PGAlias *root_00;
  undefined1 auVar2 [8];
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true> oVar3;
  PGList *pPVar4;
  PGNode *pPVar5;
  pointer pTVar6;
  type ref;
  PGFuncCall *pPVar7;
  NotImplementedException *pNVar8;
  ParserException *this_00;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_68;
  undefined1 local_60 [8];
  optional_ptr<duckdb_libpgquery::PGFuncCall,_true> func_call;
  optional_ptr<duckdb_libpgquery::PGNode,_true> call_tree;
  optional_ptr<duckdb_libpgquery::PGList,_true> function_sublist;
  
  if (*(char *)(in_RDX + 5) == '\x01') {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&func_call,"WITH ORDINALITY not implemented",(allocator *)&function_sublist
              );
    NotImplementedException::NotImplementedException(pNVar8,(string *)&func_call);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(char *)(in_RDX + 6) == '\x01') {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&func_call,"ROWS FROM() not implemented",(allocator *)&function_sublist);
    NotImplementedException::NotImplementedException(pNVar8,(string *)&func_call);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)(*(long *)(in_RDX + 8) + 4) != 1) {
    pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&func_call,"Need exactly one function",(allocator *)&function_sublist);
    NotImplementedException::NotImplementedException(pNVar8,(string *)&func_call);
    __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  function_sublist.ptr = (PGList *)**(undefined8 **)(*(long *)(in_RDX + 8) + 8);
  pPVar4 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&function_sublist);
  call_tree.ptr = *(PGNode **)&pPVar4->head->data;
  pPVar4 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&function_sublist);
  if ((pPVar4->head->next->data).ptr_value == (void *)0x0) {
    make_uniq<duckdb::TableFunctionRef>();
    pPVar5 = optional_ptr<duckdb_libpgquery::PGNode,_true>::operator->(&call_tree);
    if (pPVar5->type == T_PGSQLValueFunction) {
      local_60 = (undefined1  [8])call_tree.ptr;
      optional_ptr<duckdb_libpgquery::PGSQLValueFunction,_true>::operator*
                ((optional_ptr<duckdb_libpgquery::PGSQLValueFunction,_true> *)local_60);
      TransformSQLValueFunction((Transformer *)&func_call,(PGSQLValueFunction *)root);
      pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_68);
      oVar3 = func_call;
      func_call.ptr = (PGFuncCall *)0x0;
      _Var1._M_head_impl =
           (pTVar6->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar6->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)oVar3.ptr;
      if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        if (func_call.ptr != (PGFuncCall *)0x0) {
          (**(code **)(*(long *)func_call.ptr + 8))();
        }
      }
    }
    else {
      if (pPVar5->type != T_PGFuncCall) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&func_call,"Not a function call or value function",
                   (allocator *)local_60);
        ParserException::ParserException(this_00,(string *)&func_call);
        __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      func_call.ptr = (PGFuncCall *)call_tree.ptr;
      optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::operator*(&func_call);
      TransformFuncCall((Transformer *)local_60,(PGFuncCall *)root);
      pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_68);
      auVar2 = local_60;
      local_60 = (undefined1  [8])0x0;
      _Var1._M_head_impl =
           (pTVar6->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar6->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)auVar2;
      if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
        if (local_60 != (undefined1  [8])0x0) {
          (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_60)->ptr->options)();
        }
      }
      ref = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
            ::operator*((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)&local_68);
      pPVar7 = optional_ptr<duckdb_libpgquery::PGFuncCall,_true>::operator->(&func_call);
      SetQueryLocation(&ref->super_TableRef,pPVar7->location);
    }
    root_00 = *(PGAlias **)(in_RDX + 0x10);
    pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)&local_68);
    TransformAlias((string *)&func_call,(Transformer *)root,root_00,
                   &(pTVar6->super_TableRef).column_name_alias);
    pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
             ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                           *)&local_68);
    ::std::__cxx11::string::operator=
              ((string *)&(pTVar6->super_TableRef).alias,(string *)&func_call);
    ::std::__cxx11::string::~string((string *)&func_call);
    if (*(long *)(in_RDX + 0x20) != 0) {
      TransformSampleOptions
                ((Transformer *)&func_call,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_68);
      oVar3 = func_call;
      func_call.ptr = (PGFuncCall *)0x0;
      ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      reset((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
            &(pTVar6->super_TableRef).sample,(pointer)oVar3.ptr);
      ::std::unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      ~unique_ptr((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
                  &func_call);
    }
    (this->parent).ptr = (Transformer *)local_68._M_head_impl;
    return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
           (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
  }
  pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&func_call,"Explicit column definition not supported yet",
             (allocator *)&local_68);
  NotImplementedException::NotImplementedException(pNVar8,(string *)&func_call);
  __cxa_throw(pNVar8,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<TableRef> Transformer::TransformRangeFunction(duckdb_libpgquery::PGRangeFunction &root) {
	if (root.ordinality) {
		throw NotImplementedException("WITH ORDINALITY not implemented");
	}
	if (root.is_rowsfrom) {
		throw NotImplementedException("ROWS FROM() not implemented");
	}
	if (root.functions->length != 1) {
		throw NotImplementedException("Need exactly one function");
	}
	auto function_sublist = PGPointerCast<duckdb_libpgquery::PGList>(root.functions->head->data.ptr_value);
	D_ASSERT(function_sublist->length == 2);
	auto call_tree = PGPointerCast<duckdb_libpgquery::PGNode>(function_sublist->head->data.ptr_value);
	auto coldef = function_sublist->head->next->data.ptr_value;

	if (coldef) {
		throw NotImplementedException("Explicit column definition not supported yet");
	}
	// transform the function call
	auto result = make_uniq<TableFunctionRef>();
	switch (call_tree->type) {
	case duckdb_libpgquery::T_PGFuncCall: {
		auto func_call = PGPointerCast<duckdb_libpgquery::PGFuncCall>(call_tree.get());
		result->function = TransformFuncCall(*func_call);
		SetQueryLocation(*result, func_call->location);
		break;
	}
	case duckdb_libpgquery::T_PGSQLValueFunction:
		result->function =
		    TransformSQLValueFunction(*PGPointerCast<duckdb_libpgquery::PGSQLValueFunction>(call_tree.get()));
		break;
	default:
		throw ParserException("Not a function call or value function");
	}
	result->alias = TransformAlias(root.alias, result->column_name_alias);
	if (root.sample) {
		result->sample = TransformSampleOptions(root.sample);
	}
	return std::move(result);
}